

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ports.cpp
# Opt level: O2

void rtosc::walk_ports(Ports *base,char *name_buffer,size_t buffer_size,void *data,
                      port_walker_t walker,bool expand_bundles,void *runtime,bool ranges)

{
  char *__s;
  bool bVar1;
  size_t sVar2;
  Port *port;
  char *pcVar3;
  char *pcVar4;
  pointer pPVar5;
  char *old_end;
  Port *p;
  pointer p_00;
  port_walker_t walker_local;
  pointer local_40;
  ulong local_38;
  
  if (base != (Ports *)0x0) {
    if (*name_buffer == '\0') {
      *name_buffer = '/';
    }
    walker_local = walker;
    sVar2 = strlen(name_buffer);
    port = Ports::operator[](base,"self:");
    bVar1 = port_is_enabled(port,name_buffer,buffer_size,base,runtime,false,walker,data);
    if (bVar1) {
      old_end = name_buffer + sVar2;
      pPVar5 = (base->ports).super__Vector_base<rtosc::Port,_std::allocator<rtosc::Port>_>._M_impl.
               super__Vector_impl_data._M_finish;
      local_38 = (ulong)ranges;
      local_40 = pPVar5;
      for (p_00 = (base->ports).super__Vector_base<rtosc::Port,_std::allocator<rtosc::Port>_>.
                  _M_impl.super__Vector_impl_data._M_start; p_00 != pPVar5; p_00 = p_00 + 1) {
        pcVar4 = old_end;
        if (p_00->ports == (Ports *)0x0) {
          __s = p_00->name;
          pcVar3 = strchr(__s,0x23);
          if (pcVar3 == (char *)0x0) {
            scat(name_buffer,__s);
            (*walker_local)(p_00,name_buffer,old_end,base,data,runtime);
            pPVar5 = local_40;
          }
          else {
            bundle_foreach<void(*)(rtosc::Port_const*,char_const*,char_const*,rtosc::Ports_const&,void*,void*)>
                      (p_00,__s,old_end,name_buffer,buffer_size,base,data,runtime,&walker_local,
                       expand_bundles,true,SUB81(local_38,0));
            pPVar5 = local_40;
          }
        }
        else {
          walk_ports_recurse0(p_00,name_buffer,buffer_size,base,data,walker_local,runtime,old_end,
                              old_end,expand_bundles,p_00->name,SUB81(local_38,0));
        }
        for (; *pcVar4 != '\0'; pcVar4 = pcVar4 + 1) {
          *pcVar4 = '\0';
        }
      }
    }
  }
  return;
}

Assistant:

void rtosc::walk_ports(const Ports  *base,
                       char         *name_buffer,
                       size_t        buffer_size,
                       void         *data,
                       port_walker_t walker,
                       bool          expand_bundles,
                       void*         runtime,
                       bool          ranges)
{
    //only walk valid ports
    if(!base)
        return;

    assert(name_buffer);
    //XXX buffer_size is not properly handled yet
    if(name_buffer[0] == 0)
        name_buffer[0] = '/';

    char * const old_end = name_buffer + strlen(name_buffer);

    if(port_is_enabled((*base)["self:"], name_buffer, buffer_size, *base,
                       runtime, false, walker, data))
    for(const Port &p: *base) {
        //if(strchr(p.name, '/')) {//it is another tree
        if(p.ports) {//it is another tree

            walk_ports_recurse0(p, name_buffer, buffer_size,
                                base, data, walker, runtime, old_end, old_end,
                                expand_bundles, p.name, ranges);

        } else {
            if(strchr(p.name,'#')) {
                bundle_foreach(p, p.name, old_end, name_buffer, buffer_size, *base,
                               data, runtime, walker, expand_bundles, true, ranges);
            } else {
                //Append the path
                scat(name_buffer, p.name);

                //Apply walker function
                walker(&p, name_buffer, old_end, *base, data, runtime);
            }
        }

        //Remove the rest of the path
        char *tmp = old_end;
        while(*tmp) *tmp++=0;
    }
}